

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

bool __thiscall
dgPolyhedra::AddFace::IntersectionFilter::Insert(IntersectionFilter *this,HaI32 dummy,HaI64 value)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  
  uVar1 = this->m_count;
  uVar3 = (ulong)(~((int)uVar1 >> 0x1f) & uVar1);
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    if (this->m_array[uVar2] == CONCAT44(in_register_00000034,dummy)) goto LAB_00da047a;
  }
  this->m_array[uVar3] = CONCAT44(in_register_00000034,dummy);
  this->m_count = uVar1 + 1;
LAB_00da047a:
  return (long)(int)uVar1 <= (long)uVar2;
}

Assistant:

bool Insert (hacd::HaI32 dummy, hacd::HaI64 value)
		{
			hacd::HaI32 i;				
			for (i = 0 ; i < m_count; i ++) {
				if (m_array[i] == value) {
					return false;
				}
			}
			m_array[i] = value;
			m_count ++;
			return true;
		}